

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.cpp
# Opt level: O0

arguments_t * __thiscall arguments_t::operator[][abi_cxx11_(arguments_t *this,int index)

{
  const_reference pvVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  int index_local;
  arguments_t *this_local;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(CONCAT44(in_register_00000034,index) + 0x30),(long)in_EDX);
  std::__cxx11::string::string((string *)this,(string *)pvVar1);
  return this;
}

Assistant:

std::string arguments_t::operator[](int index) const {
    return this->parameters[index];
}